

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void __thiscall crnlib::task_pool::task_pool(task_pool *this,uint num_threads)

{
  uint uVar1;
  bool status;
  uint num_threads_local;
  task_pool *this_local;
  
  tsstack<crnlib::task_pool::task,_16U>::tsstack(&this->m_task_stack);
  this->m_num_threads = 0;
  semaphore::semaphore(&this->m_tasks_available,0,0x7fff,(char *)0x0);
  semaphore::semaphore(&this->m_all_tasks_completed,0,1,(char *)0x0);
  this->m_total_submitted_tasks = 0;
  this->m_total_completed_tasks = 0;
  this->m_exit_flag = 0;
  utils::zero_object<unsigned_long[16]>(&this->m_threads);
  uVar1 = init(this,(EVP_PKEY_CTX *)(ulong)num_threads);
  if ((uVar1 & 1) == 0) {
    crnlib_assert("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_threading_pthreads.cpp"
                  ,0x150);
  }
  return;
}

Assistant:

task_pool::task_pool(uint num_threads):
        m_num_threads(0),
        m_tasks_available(0, 32767),
        m_all_tasks_completed(0, 1),
        m_total_submitted_tasks(0),
        m_total_completed_tasks(0),
        m_exit_flag(false)
    {
        utils::zero_object(m_threads);

        bool status = init(num_threads);
        CRNLIB_VERIFY(status);
    }